

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::printReadable(CFG *this)

{
  Production *this_00;
  bool bVar1;
  ostream *poVar2;
  reference ppPVar3;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  reference pbVar5;
  string local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> el;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Production *production;
  iterator __end1;
  iterator __begin1;
  vector<Production_*,_std::allocator<Production_*>_> *__range1;
  string local_30;
  CFG *local_10;
  CFG *this_local;
  
  local_10 = this;
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Nonterminals: ");
  vecToStr(&local_30,this,&this->nonTerminalsV);
  poVar2 = std::operator<<(poVar2,(string *)&local_30);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,"Terminals: ");
  vecToStr((string *)&__range1,this,&this->terminalsT);
  poVar2 = std::operator<<(poVar2,(string *)&__range1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&__range1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Productions: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<Production_*,_std::allocator<Production_*>_>::begin(&this->productionsP);
  production = (Production *)
               std::vector<Production_*,_std::allocator<Production_*>_>::end(&this->productionsP);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
                                *)&production);
    if (!bVar1) break;
    ppPVar3 = __gnu_cxx::
              __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppPVar3;
    poVar2 = std::operator<<((ostream *)&std::cout,"\t");
    psVar4 = Production::getFromP_abi_cxx11_(this_00);
    poVar2 = std::operator<<(poVar2,(string *)psVar4);
    std::operator<<(poVar2," -> ");
    this_01 = Production::getToP_abi_cxx11_(this_00);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    el.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&el.field_2 + 8));
      if (!bVar1) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string(local_b8,(string *)pbVar5);
      std::operator<<((ostream *)&std::cout,local_b8);
      std::__cxx11::string::~string(local_b8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>::
    operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Startsymbol: ");
  poVar2 = std::operator<<(poVar2,(string *)&this->startS);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CFG::printReadable() {
    std::cout << std::endl;

    std::cout << "Nonterminals: " << vecToStr(nonTerminalsV) << std::endl;

    std::cout << "Terminals: " << vecToStr(terminalsT) << std::endl;

    std::cout << "Productions: " << std::endl;
    for (Production *production: productionsP) {
        std::cout << "\t" << production->getFromP() << " -> ";
        for (auto el: production->getToP()) {
            std::cout << el;
        }
        std::cout << std::endl;
    }

    std::cout << "Startsymbol: " << startS << std::endl;
    std::cout << std::endl;
}